

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_lda_inc.c
# Opt level: O2

void work_lda_fxc_unpol(xc_func_type *p,size_t np,double *rho,xc_lda_out_params *out)

{
  double *pdVar1;
  long lVar2;
  size_t ip;
  size_t sVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double __x;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double __x_00;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  undefined1 auVar64 [16];
  double dVar65;
  double dVar66;
  double dVar67;
  double dVar68;
  double dVar69;
  double dVar70;
  undefined1 auVar71 [16];
  double dVar72;
  double dVar73;
  double dVar74;
  double dVar75;
  undefined1 auVar76 [16];
  double dVar77;
  undefined1 auVar78 [16];
  double dVar79;
  undefined1 auVar80 [16];
  double dVar81;
  double dVar82;
  double dVar83;
  double dVar84;
  double dVar85;
  double dVar86;
  double dVar87;
  double dVar88;
  double dVar89;
  double dVar90;
  double dVar91;
  double dVar92;
  double dVar93;
  double local_388;
  double local_258;
  double local_118;
  double dStack_110;
  double local_108;
  double dStack_100;
  double local_e8;
  double dStack_e0;
  double local_c8;
  double local_a8;
  double dStack_a0;
  
  for (sVar3 = 0; np != sVar3; sVar3 = sVar3 + 1) {
    lVar2 = (long)(p->dim).rho * sVar3;
    dVar5 = rho[lVar2];
    if (p->nspin == 2) {
      dVar5 = dVar5 + rho[lVar2 + 1];
    }
    dVar12 = p->dens_threshold;
    if (dVar12 <= dVar5) {
      dVar5 = rho[lVar2];
      if (rho[lVar2] <= dVar12) {
        dVar5 = dVar12;
      }
      dVar6 = cbrt(0.3183098861837907);
      dVar7 = dVar6 * 1.4422495703074083;
      dVar8 = dVar7 * 2.519842099789747;
      dVar12 = p->zeta_threshold;
      dVar32 = 1.0;
      dVar9 = 1.0;
      if (1.0 <= dVar12) {
        dVar9 = cbrt(dVar12);
        dVar32 = dVar12 * dVar9;
      }
      dVar10 = dVar32 * 1.5874010519681996;
      dVar11 = cbrt(dVar5);
      dVar12 = cbrt(9.0);
      dVar33 = dVar6 * dVar6;
      dVar47 = p->cam_omega * dVar33 * dVar12 * dVar12;
      auVar45._8_8_ = dVar11;
      auVar45._0_8_ = dVar9;
      auVar45 = divpd(_DAT_010020a0,auVar45);
      dVar9 = auVar45._0_8_;
      dVar93 = auVar45._8_8_;
      dVar34 = (dVar9 * dVar93 * 1.4422495703074083 * dVar47) / 18.0;
      dVar12 = 1.92;
      if (dVar34 <= 1.92) {
        dVar12 = dVar34;
      }
      dVar13 = atan2(1.0,dVar12);
      dVar35 = dVar12 * dVar12;
      dVar14 = 1.0 / dVar35;
      __x = dVar14 + 1.0;
      dVar15 = log(__x);
      dVar84 = dVar34;
      if (dVar34 <= 1.92) {
        dVar84 = 1.92;
      }
      dVar70 = dVar84 * dVar84;
      dVar85 = dVar70 * dVar70;
      dVar86 = dVar85 * dVar85;
      dVar81 = dVar85 * dVar70;
      dVar83 = dVar86 * dVar86;
      auVar46._0_8_ = dVar86 * dVar70;
      auVar46._8_8_ = dVar85 * dVar86;
      auVar64._0_8_ = dVar81 * dVar86;
      auVar64._8_8_ = dVar83;
      auVar64 = divpd(_DAT_010020a0,auVar64);
      dVar65 = auVar64._8_8_;
      auVar76._8_8_ = dVar65;
      auVar76._0_8_ = dVar65;
      auVar76 = divpd(auVar76,auVar46);
      auVar71._0_8_ = dVar86 * dVar81;
      auVar71._8_8_ = dVar83 * dVar83;
      auVar26._8_8_ = dVar85;
      auVar26._0_8_ = dVar70;
      auVar78._8_8_ = dVar86;
      auVar78._0_8_ = dVar81;
      auVar28._8_8_ = dVar65;
      auVar28._0_8_ = dVar65;
      auVar78 = divpd(auVar28,auVar78);
      auVar80._8_8_ = 0x3ff0000000000000;
      auVar80._0_8_ = dVar65;
      auVar71 = divpd(auVar80,auVar71);
      auVar29._8_8_ = dVar65;
      auVar29._0_8_ = dVar65;
      auVar80 = divpd(auVar29,auVar26);
      dVar72 = auVar71._8_8_;
      auVar27._8_8_ = dVar72;
      auVar27._0_8_ = dVar72;
      auVar45 = divpd(auVar27,auVar26);
      dVar83 = dVar35 + 3.0;
      dVar36 = 1.0 - dVar15 * dVar83;
      dVar13 = dVar12 * dVar36 * 0.25 + dVar13;
      if (dVar34 < 1.92) {
        dVar67 = dVar13 * -2.6666666666666665 * dVar12 + 1.0;
      }
      else {
        auVar26 = divpd(auVar64,_DAT_0101dbe0);
        auVar27 = divpd(auVar80,_DAT_0101dbf0);
        auVar28 = divpd(auVar78,_DAT_0101dc00);
        auVar29 = divpd(auVar76,_DAT_0101dc10);
        auVar30 = divpd(auVar71,_DAT_0101dc20);
        auVar31 = divpd(auVar45,_DAT_0101dc30);
        dVar67 = ((((((((((((1.0 / auVar46._8_8_) / -364.0 +
                            (1.0 / auVar46._0_8_) / 231.0 +
                            (1.0 / dVar86) / -135.0 +
                            (1.0 / dVar81) / 70.0 + (1.0 / dVar85) / -30.0 + (1.0 / dVar70) / 9.0 +
                           auVar26._0_8_) - auVar26._8_8_) + auVar27._0_8_) - auVar27._8_8_) +
                       auVar28._0_8_) - auVar28._8_8_) + auVar29._0_8_) - auVar29._8_8_) +
                   auVar30._0_8_) - auVar30._8_8_) + auVar31._0_8_) - auVar31._8_8_;
      }
      dVar60 = dVar93 * 2.519842099789747 * dVar7;
      dVar16 = dVar60 * 0.053425 + 1.0;
      dVar17 = SQRT(dVar60);
      dVar18 = dVar17;
      if (dVar60 < 0.0) {
        dVar18 = sqrt(dVar60);
        dVar17 = sqrt(dVar60);
      }
      dVar48 = dVar33 * 2.080083823051904;
      dVar37 = 1.0 / (dVar11 * dVar11);
      dVar38 = dVar37 * 1.5874010519681996 * dVar48;
      dVar39 = dVar38 * 0.123235 + dVar17 * dVar60 * 0.204775 + dVar18 * 3.79785 + dVar60 * 0.8969;
      __x_00 = 16.081979498692537 / dVar39 + 1.0;
      dVar19 = log(__x_00);
      dVar32 = (dVar32 + dVar32 + -2.0) * 1.9236610509315362;
      dVar20 = dVar60 * 0.0278125 + 1.0;
      dVar40 = dVar38 * 0.1241775 +
               dVar17 * dVar60 * 0.1100325 + dVar18 * 5.1785 + dVar60 * 0.905775;
      dVar17 = 29.608749977793437 / dVar40 + 1.0;
      dVar21 = log(dVar17);
      dVar41 = dVar19 * -0.0621814 * dVar16 + dVar21 * 0.0197516734986138 * dVar20 * dVar32;
      dVar61 = dVar38 * 0.25 + dVar60 * -0.225 + 3.2;
      dVar49 = 1.0 / dVar61;
      dVar38 = dVar67 * -0.1875 * dVar11 * dVar10 * dVar8 + dVar49 * 3.4602 * dVar41;
      pdVar1 = out->zk;
      if ((pdVar1 != (double *)0x0) && ((p->info->flags & 1) != 0)) {
        lVar2 = (long)(p->dim).zk * sVar3;
        pdVar1[lVar2] = pdVar1[lVar2] + dVar38;
      }
      dVar70 = dVar70 * dVar84;
      dVar73 = dVar93 / dVar5;
      dVar22 = (dVar9 * dVar73 * 1.4422495703074083 * dVar47) / -54.0;
      local_388 = dVar22;
      if (dVar34 <= 1.92) {
        local_388 = 0.0;
      }
      dVar42 = dVar84 * dVar85;
      dVar79 = dVar85 * dVar70;
      dVar77 = 1.0 / (dVar84 * dVar86);
      dVar74 = 1.0 / (dVar70 * dVar86);
      dVar56 = 1.0 / (dVar86 * dVar42);
      dVar57 = 1.0 / (dVar86 * dVar79);
      dVar63 = dVar65 / (dVar84 * dVar86);
      dVar50 = dVar65 / (dVar70 * dVar86);
      dVar51 = dVar65 / (dVar86 * dVar42);
      dVar58 = dVar65 / (dVar86 * dVar79);
      uVar4 = -(ulong)(1.92 < dVar34);
      dVar22 = (double)(~uVar4 & (ulong)dVar22);
      auVar30._0_8_ = dVar12 * dVar35;
      auVar30._8_8_ = __x;
      auVar26 = divpd(_DAT_010020a0,auVar30);
      dVar52 = dVar83 * auVar26._0_8_;
      dVar69 = auVar26._8_8_;
      dVar15 = dVar15 * -2.0;
      dVar87 = dVar15 * dVar22 * dVar12 + (dVar22 * dVar69 + dVar22 * dVar69) * dVar52;
      dVar88 = dVar12 * dVar87 * 0.25 + (dVar22 * dVar36 * 0.25 - dVar14 * dVar69 * dVar22);
      if (dVar34 < 1.92) {
        dVar53 = dVar13 * -2.6666666666666665 * dVar22 + dVar88 * -2.6666666666666665 * dVar12;
      }
      else {
        dVar53 = local_388 * 0.005120910384068279 * (dVar72 / dVar42) +
                 local_388 * -0.0056808688387635755 * (dVar72 / dVar70) +
                 local_388 * 0.006337888690829867 * (dVar72 / dVar84) +
                 local_388 * -0.007115749525616698 * dVar58 +
                 local_388 * 0.008045977011494253 * dVar51 +
                 local_388 * -0.009171075837742505 * dVar50 +
                 local_388 * 0.01054945054945055 * dVar63 +
                 local_388 * -0.012263099219620958 * (dVar65 / dVar79) +
                 local_388 * 0.01443001443001443 * (dVar65 / dVar42) +
                 local_388 * -0.01722488038277512 * (dVar65 / dVar70) +
                 local_388 * 0.02091503267973856 * (dVar65 / dVar84) +
                 local_388 * -0.025925925925925925 * dVar57 +
                 local_388 * 0.03296703296703297 * dVar56 +
                 local_388 * -0.04329004329004329 * dVar74 +
                 local_388 * 0.05925925925925926 * dVar77 +
                 local_388 * -0.08571428571428572 * (1.0 / dVar79) +
                 local_388 * -0.2222222222222222 * (1.0 / dVar70) +
                 local_388 * 0.13333333333333333 * (1.0 / dVar42);
      }
      dVar82 = dVar11 * dVar53 * dVar10 * dVar8;
      dVar62 = dVar73 * 2.519842099789747;
      dVar23 = dVar39 * dVar39;
      dVar24 = dVar16 * (1.0 / dVar23);
      dVar6 = dVar6 * 2.519842099789747;
      dVar66 = dVar6 * dVar73 * (1.4422495703074083 / dVar18);
      dVar68 = dVar7 * dVar62;
      if (dVar60 < 0.0) {
        dVar43 = sqrt(dVar60);
      }
      else {
        dVar43 = SQRT(dVar60);
      }
      dVar89 = dVar6 * dVar73 * dVar43 * 1.4422495703074083;
      dVar25 = (dVar37 / dVar5) * 1.5874010519681996 * dVar48;
      dVar54 = dVar25 * -0.08215666666666667 +
               dVar89 * -0.1023875 + dVar66 * -0.632975 + dVar68 * -0.29896666666666666;
      dVar75 = 1.0 / __x_00;
      dVar20 = dVar20 * dVar32;
      dVar44 = dVar40 * dVar40;
      dVar89 = dVar25 * -0.082785 +
               dVar89 * -0.05501625 + dVar66 * -0.8630833333333333 + dVar68 * -0.301925;
      dVar90 = 1.0 / dVar17;
      dVar91 = dVar90 * dVar89 * (1.0 / dVar44);
      dVar92 = dVar91 * -0.5848223622634646 * dVar20 +
               dVar21 * -0.00018311447306006544 * dVar73 * dVar6 * dVar32 * 1.4422495703074083 +
               dVar19 * 0.0011073470983333333 * dVar62 * dVar7 + dVar24 * dVar75 * dVar54;
      dVar59 = dVar49 * dVar92;
      dVar55 = 1.0 / (dVar61 * dVar61);
      dVar25 = dVar68 * 0.075 + dVar25 / -6.0;
      dVar66 = dVar25 * dVar55 * dVar41;
      dVar68 = -dVar67 * dVar37 * dVar10 * dVar8;
      pdVar1 = out->vrho;
      if ((pdVar1 != (double *)0x0) && ((p->info->flags & 2) != 0)) {
        lVar2 = (long)(p->dim).vrho * sVar3;
        pdVar1[lVar2] =
             (dVar66 * -3.4602 + dVar59 * 3.4602 + dVar82 * -0.1875 + dVar68 * 0.0625) * dVar5 +
             dVar38 + pdVar1[lVar2];
      }
      dVar93 = dVar93 / (dVar5 * dVar5);
      dVar47 = dVar47 * dVar9 * 0.024691358024691357 * dVar93 * 1.4422495703074083;
      if (dVar34 < 1.92) {
        dVar84 = 1.0 / (__x * __x);
        dVar9 = 1.0 / (dVar35 * dVar35);
        dVar47 = (double)(~uVar4 & (ulong)dVar47);
        dVar34 = dVar22 * dVar22;
        dVar12 = ((dVar34 * dVar15 +
                   (dVar47 * dVar69 + dVar47 * dVar69) * dVar52 +
                   dVar69 * 8.0 * dVar34 * dVar14 + dVar15 * dVar47 * dVar12 +
                   dVar9 * dVar83 * dVar34 * dVar69 * -6.0 +
                  (dVar9 / dVar35) * dVar83 * dVar84 * dVar34 * 4.0) * dVar12 * 0.25 +
                 dVar36 * dVar47 * 0.25 +
                 (dVar9 / dVar12) * dVar84 * -2.0 * dVar34 +
                 dVar47 * dVar14 * -dVar69 + dVar69 * 2.0 * dVar34 * auVar26._0_8_ +
                 dVar87 * dVar22 * 0.5) * -2.6666666666666665 * dVar12 +
                 dVar13 * -2.6666666666666665 * dVar47 + dVar88 * -5.333333333333333 * dVar22;
      }
      else {
        dVar47 = (double)(uVar4 & (ulong)dVar47);
        local_388 = local_388 * local_388;
        local_118 = auVar80._0_8_;
        dStack_110 = auVar80._8_8_;
        local_108 = auVar78._0_8_;
        dStack_100 = auVar78._8_8_;
        local_e8 = auVar76._0_8_;
        dStack_e0 = auVar76._8_8_;
        local_c8 = auVar71._0_8_;
        local_a8 = auVar45._0_8_;
        dStack_a0 = auVar45._8_8_;
        local_258 = auVar64._0_8_;
        dVar12 = local_258 * local_388 * -0.42857142857142855 +
                 (1.0 / auVar46._8_8_) * local_388 * 0.47619047619047616 +
                 (1.0 / auVar46._0_8_) * local_388 * -0.5333333333333333 +
                 (1.0 / dVar86) * local_388 * 0.6 +
                 (1.0 / dVar81) * -(local_388 * 0.6666666666666666) +
                 (1.0 / dVar85) * local_388 * 0.6666666666666666 +
                 dStack_a0 * local_388 * 0.19883040935672514 +
                 local_a8 * local_388 * -0.20915032679738563 +
                 dVar72 * local_388 * 0.22058823529411764 +
                 local_c8 * local_388 * -0.23333333333333334 +
                 dStack_e0 * local_388 * 0.24761904761904763 +
                 local_e8 * local_388 * -0.26373626373626374 +
                 dStack_100 * local_388 * 0.28205128205128205 +
                 local_108 * local_388 * -0.30303030303030304 +
                 dStack_110 * local_388 * 0.32727272727272727 +
                 dVar65 * local_388 * 0.3888888888888889 +
                 local_118 * local_388 * -0.35555555555555557 +
                 local_388 * -0.18947368421052632 * (dVar72 / dVar81) +
                 (dVar72 / dVar42) * dVar47 * 0.005120910384068279 +
                 (dVar72 / dVar70) * dVar47 * -0.0056808688387635755 +
                 (dVar72 / dVar84) * dVar47 * 0.006337888690829867 +
                 dVar58 * dVar47 * -0.007115749525616698 +
                 dVar47 * dVar51 * 0.008045977011494253 +
                 dVar50 * dVar47 * -0.009171075837742505 +
                 (dVar65 / dVar79) * dVar47 * -0.012263099219620958 +
                 (dVar65 / dVar42) * dVar47 * 0.01443001443001443 +
                 (dVar65 / dVar70) * dVar47 * -0.01722488038277512 +
                 (dVar65 / dVar84) * dVar47 * 0.02091503267973856 +
                 dVar57 * dVar47 * -0.025925925925925925 +
                 dVar56 * dVar47 * 0.03296703296703297 +
                 dVar74 * dVar47 * -0.04329004329004329 +
                 dVar77 * dVar47 * 0.05925925925925926 +
                 (1.0 / dVar79) * dVar47 * -0.08571428571428572 +
                 (1.0 / dVar70) * dVar47 * -0.2222222222222222 +
                 (1.0 / dVar42) * dVar47 * 0.13333333333333333 +
                 dVar63 * dVar47 * 0.01054945054945055;
      }
      dVar34 = dVar37 / (dVar5 * dVar5);
      dVar9 = dVar33 * 1.5874010519681996 * dVar34;
      dVar33 = ((2.080083823051904 / dVar18) / dVar60) * dVar9;
      dVar47 = (1.4422495703074083 / dVar18) * dVar6 * dVar93;
      dVar84 = dVar7 * dVar93 * 2.519842099789747;
      if (dVar60 < 0.0) {
        dVar60 = sqrt(dVar60);
      }
      else {
        dVar60 = SQRT(dVar60);
      }
      dVar9 = dVar9 * (1.0 / dVar60) * 2.080083823051904;
      dVar14 = dVar6 * dVar93 * dVar43 * 1.4422495703074083;
      dVar48 = dVar48 * dVar34 * 1.5874010519681996;
      pdVar1 = out->v2rho2;
      if ((pdVar1 != (double *)0x0) && ((p->info->flags & 4) != 0)) {
        lVar2 = (long)(p->dim).v2rho2 * sVar3;
        pdVar1[lVar2] =
             ((dVar84 * -0.1 + dVar48 * 0.2777777777777778) * dVar55 * dVar41 * -3.4602 +
             dVar25 * dVar25 * (dVar55 / dVar61) * dVar41 * 6.9204 +
             dVar92 * dVar55 * dVar25 * -6.9204 +
             dVar49 * ((1.0 / (dVar17 * dVar17)) * (1.0 / (dVar44 * dVar44)) * dVar89 * dVar89 *
                       -17.315859105681465 * dVar20 +
                      (1.0 / dVar44) *
                      (dVar48 * 0.137975 +
                      dVar14 * 0.073355 +
                      dVar9 * 0.0366775 +
                      dVar84 * 0.4025666666666667 +
                      dVar33 * -0.5753888888888888 + dVar47 * 1.1507777777777777) * dVar90 *
                      -0.5848223622634646 * dVar20 +
                      dVar90 * dVar89 * dVar89 * (1.0 / (dVar40 * dVar44)) * 1.1696447245269292 *
                      dVar20 + dVar62 * dVar91 * 0.01084358130030174 * dVar32 * dVar7 +
                               dVar6 * dVar93 * dVar21 * 0.00024415263074675396 *
                               dVar32 * 1.4422495703074083 +
                               (1.0 / (__x_00 * __x_00)) * dVar54 * dVar54 * 16.081979498692537 *
                               dVar16 * (1.0 / (dVar23 * dVar23)) +
                               dVar75 * (dVar48 * 0.1369277777777778 +
                                        dVar14 * 0.13651666666666668 +
                                        dVar9 * 0.06825833333333334 +
                                        dVar84 * 0.3986222222222222 +
                                        dVar33 * -0.4219833333333333 + dVar47 * 0.8439666666666666)
                               * dVar24 +
                               dVar75 * dVar54 * dVar54 * -2.0 * (1.0 / (dVar39 * dVar23)) * dVar16
                               + dVar93 * 2.519842099789747 * dVar19 * -0.0014764627977777779 *
                                 dVar7 + dVar73 * (1.0 / dVar23) *
                                         dVar75 * dVar54 * -0.035616666666666665 * dVar8) * 3.4602 +
             dVar11 * dVar12 * dVar10 * dVar8 * -0.1875 +
             (((dVar37 / dVar5) * dVar67 * dVar10 * dVar8) / 24.0 -
             dVar8 * dVar10 * dVar37 * dVar53 * 0.125)) * dVar5 +
             dVar66 * -6.9204 + dVar59 * 6.9204 + dVar82 * -0.375 + dVar68 * 0.125 + pdVar1[lVar2];
      }
    }
  }
  return;
}

Assistant:

static void
WORK_LDA(ORDER_TXT, SPIN_TXT)
(const XC(func_type) *p, size_t np, const double *rho, xc_lda_out_params *out)
{

#ifdef XC_DEBUG
  /* This throws an exception when floating point errors are encountered */
  /*feenableexcept(FE_DIVBYZERO | FE_INVALID);*/
#endif

  size_t ip;
  double dens;
  double my_rho[2] = {0.0, 0.0};

  for(ip = 0; ip < np; ip++){
    /* Screen low density */
    dens = (p->nspin == XC_POLARIZED) ? VAR(rho, ip, 0) + VAR(rho, ip, 1) : VAR(rho, ip, 0);
    if(dens < p->dens_threshold)
      continue;
    
    /* sanity check of input parameters */
    my_rho[0] = m_max(p->dens_threshold, VAR(rho, ip, 0));
    if(p->nspin == XC_POLARIZED){
      my_rho[1] = m_max(p->dens_threshold, VAR(rho, ip, 1));
    }

    FUNC(ORDER_TXT, SPIN_TXT)(p, ip, my_rho, out);

    /* check for NaNs */
#ifdef XC_DEBUG
    {
      const xc_dimensions *dim = &(p->dim);
      int ii, is_OK = 1;

      if(out->zk != NULL)
        is_OK = is_OK & isfinite(out->VAR(zk, ip, 0));

      if(out->vrho != NULL){
        for(ii=0; ii < dim->vrho; ii++)
          is_OK = is_OK && isfinite(out->VAR(vrho, ip, ii));
      }

      if(!is_OK){
        printf("Problem in the evaluation of the functional\n");
        if(p->nspin == XC_UNPOLARIZED){
          printf("./xc-get_data %d 1 %le 0.0 0.0 0.0 0.0 0.0 0.0 0.0 0.0\n",
                 p->info->number, VAR(rho, ip, 0));
        }else{
          printf("./xc-get_data %d 2 %le %le 0.0 0.0 0.0 0.0 0.0 0.0 0.0\n",
                 p->info->number, VAR(rho, ip, 0), VAR(rho, ip, 1));
        }
      }
    }
#endif
  }   /* for(ip) */

}